

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_private_key_verify(uchar *priv_key,size_t priv_key_len)

{
  int iVar1;
  secp256k1_context *ctx_00;
  secp256k1_context *ctx;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  
  ctx_00 = secp_ctx();
  if (ctx_00 == (secp256k1_context *)0x0) {
    priv_key_local._4_4_ = -3;
  }
  else if ((priv_key == (uchar *)0x0) || (priv_key_len != 0x20)) {
    priv_key_local._4_4_ = -2;
  }
  else {
    iVar1 = secp256k1_ec_seckey_verify(ctx_00,priv_key);
    priv_key_local._4_4_ = -2;
    if (iVar1 != 0) {
      priv_key_local._4_4_ = 0;
    }
  }
  return priv_key_local._4_4_;
}

Assistant:

int wally_ec_private_key_verify(const unsigned char *priv_key, size_t priv_key_len)
{
    const secp256k1_context *ctx = secp_ctx();

    if (!ctx)
        return WALLY_ENOMEM;

    if (!priv_key || priv_key_len != EC_PRIVATE_KEY_LEN)
        return WALLY_EINVAL;

    return secp256k1_ec_seckey_verify(ctx, priv_key) ? WALLY_OK : WALLY_EINVAL;
}